

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::BuffersTest::testSize
          (BuffersTest *this,GLuint index,GLint expected_value,GLchar *tested_function_name)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLint64 buffer_size;
  GLint64 local_1b8;
  undefined1 local_1b0 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b8 = -1;
  (*this->m_gl_getTransformFeedbacki64_v)(this->m_xfb_dsa,0x8c85,index,&local_1b8);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetTransformFeedbacki_v have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x371);
  if (local_1b8 == -1) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),
                    "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_SIZE has not returned anything and error has not been generated."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (local_1b8 == expected_value) {
      return true;
    }
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_SIZE has returned "
                   );
    std::ostream::_M_insert<long>((long)this_00);
    std::operator<<((ostream *)this_00,", however ");
    std::ostream::operator<<(this_00,expected_value);
    std::operator<<((ostream *)this_00," is expected. As a consequence function ");
    std::operator<<((ostream *)this_00,tested_function_name);
    std::operator<<((ostream *)this_00," have failed to setup proper value.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  return false;
}

Assistant:

bool BuffersTest::testSize(glw::GLuint const index, glw::GLint const expected_value,
						   glw::GLchar const* const tested_function_name)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check default buffer's size value. */
	glw::GLint64 buffer_size = -1;

	m_gl_getTransformFeedbacki64_v(m_xfb_dsa, GL_TRANSFORM_FEEDBACK_BUFFER_SIZE, index, &buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTransformFeedbacki_v have failed");

	/* Checking results and errors. */
	if (-1 == buffer_size)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_SIZE "
										"has not returned anything and error has not been generated."
			<< tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		if (expected_value != buffer_size)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_SIZE has returned "
				<< buffer_size << ", however " << expected_value << " is expected. As a consequence function "
				<< tested_function_name << " have failed to setup proper value." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}